

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *psVar4;
  ostream *poVar5;
  allocator<char> local_109;
  string local_108 [38];
  Colour local_e2;
  allocator<char> local_e1;
  string local_e0 [38];
  Colour local_ba;
  allocator<char> local_b9;
  string local_b8 [38];
  Colour local_92;
  allocator<char> local_91;
  string local_90 [35];
  Colour local_6d [20];
  allocator<char> local_59;
  string local_58 [39];
  Colour local_31;
  size_t local_30;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  Totals *totals_local;
  ConsoleReporter *this_local;
  
  failedRatio = (size_t)totals;
  totals_local = (Totals *)this;
  sVar2 = Counts::total(&totals->testCases);
  if (sVar2 == 0) {
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::Colour(&local_e2,BrightYellow);
    poVar5 = Catch::operator<<(poVar5,&local_e2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,0x4f,'=',&local_109);
    std::operator<<((ostream *)poVar5,local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    Colour::~Colour(&local_e2);
  }
  else {
    sVar2 = *(size_t *)(failedRatio + 0x28);
    sVar3 = Counts::total((Counts *)(failedRatio + 0x20));
    failedButOkRatio = anon_unknown_2::makeRatio(sVar2,sVar3);
    sVar2 = *(size_t *)(failedRatio + 0x30);
    sVar3 = Counts::total((Counts *)(failedRatio + 0x20));
    passedRatio = anon_unknown_2::makeRatio(sVar2,sVar3);
    sVar2 = *(size_t *)(failedRatio + 0x20);
    sVar3 = Counts::total((Counts *)(failedRatio + 0x20));
    local_30 = anon_unknown_2::makeRatio(sVar2,sVar3);
    while (failedButOkRatio + passedRatio + local_30 < 0x4f) {
      psVar4 = anon_unknown_2::findMax(&failedButOkRatio,&passedRatio,&local_30);
      *psVar4 = *psVar4 + 1;
    }
    while (0x4f < failedButOkRatio + passedRatio + local_30) {
      psVar4 = anon_unknown_2::findMax(&failedButOkRatio,&passedRatio,&local_30);
      *psVar4 = *psVar4 - 1;
    }
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::Colour(&local_31,BrightRed);
    poVar5 = Catch::operator<<(poVar5,&local_31);
    sVar2 = failedButOkRatio;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,sVar2,'=',&local_59);
    std::operator<<((ostream *)poVar5,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    Colour::~Colour(&local_31);
    poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::Colour(local_6d,BrightYellow);
    poVar5 = Catch::operator<<(poVar5,local_6d);
    sVar2 = passedRatio;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_90,sVar2,'=',&local_91);
    std::operator<<((ostream *)poVar5,local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    Colour::~Colour(local_6d);
    bVar1 = Counts::allPassed((Counts *)(failedRatio + 0x20));
    if (bVar1) {
      poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
      Colour::Colour(&local_92,BrightGreen);
      poVar5 = Catch::operator<<(poVar5,&local_92);
      sVar2 = local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b8,sVar2,'=',&local_b9);
      std::operator<<((ostream *)poVar5,local_b8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      Colour::~Colour(&local_92);
    }
    else {
      poVar5 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
      Colour::Colour(&local_ba,Green);
      poVar5 = Catch::operator<<(poVar5,&local_ba);
      sVar2 = local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e0,sVar2,'=',&local_e1);
      std::operator<<((ostream *)poVar5,local_e0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      Colour::~Colour(&local_ba);
    }
  }
  std::operator<<((ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n'
                 );
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)--;

        stream << Colour(Colour::Error) << std::string(failedRatio, '=');
        stream << Colour(Colour::ResultExpectedFailure) << std::string(failedButOkRatio, '=');
        if (totals.testCases.allPassed())
            stream << Colour(Colour::ResultSuccess) << std::string(passedRatio, '=');
        else
            stream << Colour(Colour::Success) << std::string(passedRatio, '=');
    } else {
        stream << Colour(Colour::Warning) << std::string(CATCH_CONFIG_CONSOLE_WIDTH - 1, '=');
    }
    stream << '\n';
}